

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SingleBindingCase::createBuffers(SingleBindingCase *this)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  float *pfVar6;
  size_type sVar7;
  TestError *this_00;
  float fVar8;
  float fVar9;
  float *local_128;
  allocator<char> local_101;
  string local_100;
  int local_e0;
  int local_dc;
  int v_1;
  int v;
  Vec4 positions [6];
  Vec4 *color;
  int local_68;
  int x;
  int y;
  Vec4 colorB;
  Vec4 colorA;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dataBuf;
  Functions *gl;
  SingleBindingCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  iVar3 = (this->m_spec).bufferOffset;
  iVar1 = (this->m_spec).bufferStride;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
             (long)(iVar3 + iVar1 * 0x960),&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.5,1.0,0.0,1.0);
  for (local_68 = 0; local_68 < 0x14; local_68 = local_68 + 1) {
    for (color._4_4_ = 0; color._4_4_ < 0x14; color._4_4_ = color._4_4_ + 1) {
      if ((color._4_4_ + local_68) % 2 == 0) {
        local_128 = colorB.m_data + 2;
      }
      else {
        local_128 = (float *)&x;
      }
      positions[5].m_data._8_8_ = local_128;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&v_1,
                 (float)color._4_4_ / 20.0 + (float)color._4_4_ / 20.0 + -1.0,
                 (float)local_68 / 20.0 + (float)local_68 / 20.0 + -1.0,0.0,1.0);
      fVar8 = (float)(local_68 + 1) / 20.0;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(positions[0].m_data + 2),
                 (float)color._4_4_ / 20.0 + (float)color._4_4_ / 20.0 + -1.0,fVar8 + fVar8 + -1.0,
                 0.0,1.0);
      fVar8 = (float)(color._4_4_ + 1) / 20.0;
      fVar9 = (float)(local_68 + 1) / 20.0;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(positions[1].m_data + 2),fVar8 + fVar8 + -1.0,
                 fVar9 + fVar9 + -1.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(positions[2].m_data + 2),
                 (float)color._4_4_ / 20.0 + (float)color._4_4_ / 20.0 + -1.0,
                 (float)local_68 / 20.0 + (float)local_68 / 20.0 + -1.0,0.0,1.0);
      fVar8 = (float)(color._4_4_ + 1) / 20.0;
      fVar9 = (float)(local_68 + 1) / 20.0;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(positions[3].m_data + 2),fVar8 + fVar8 + -1.0,
                 fVar9 + fVar9 + -1.0,0.0,1.0);
      fVar8 = (float)(color._4_4_ + 1) / 20.0;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(positions[4].m_data + 2),fVar8 + fVar8 + -1.0,
                 (float)local_68 / 20.0 + (float)local_68 / 20.0 + -1.0,0.0,1.0);
      for (local_dc = 0; local_dc < 6; local_dc = local_dc + 1) {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                            (long)((this->m_spec).bufferOffset + (this->m_spec).positionAttrOffset +
                                  (this->m_spec).bufferStride *
                                  (local_dc + (color._4_4_ + local_68 * 0x14) * 6)));
        pfVar6 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)(&v_1 + (long)local_dc * 4));
        *(undefined8 *)pvVar5 = *(undefined8 *)pfVar6;
        *(undefined8 *)(pvVar5 + 8) = *(undefined8 *)(pfVar6 + 2);
      }
      if (((this->m_spec).hasColorAttr & 1U) != 0) {
        for (local_e0 = 0; local_e0 < 6; local_e0 = local_e0 + 1) {
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                              (long)((this->m_spec).bufferOffset + (this->m_spec).colorAttrOffset +
                                    (this->m_spec).bufferStride *
                                    (local_e0 + (color._4_4_ + local_68 * 0x14) * 6)));
          pfVar6 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)positions[5].m_data._8_8_);
          *(undefined8 *)pvVar5 = *(undefined8 *)pfVar6;
          *(undefined8 *)(pvVar5 + 8) = *(undefined8 *)(pfVar6 + 2);
        }
      }
    }
  }
  (**(code **)(dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x6c8))(1,&this->m_buf);
  (**(code **)(dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x40))(0x8892,this->m_buf);
  pcVar2 = *(code **)(dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x150);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  (*pcVar2)(0x8892,sVar7,pvVar5,0x88e4);
  (**(code **)(dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x40))(0x8892,0);
  iVar3 = (**(code **)(dataBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x800))();
  if (iVar3 == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"could not init buffer",&local_101);
  tcu::TestError::TestError(this_00,&local_100);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SingleBindingCase::createBuffers (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	std::vector<deUint8>	dataBuf	(m_spec.bufferOffset + m_spec.bufferStride * GRID_SIZE * GRID_SIZE * 6);

	// In interleaved mode color rg and position zw are the same. Select "good" values for r and g
	const tcu::Vec4			colorA	(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			colorB	(0.5f, 1.0f, 0.0f, 1.0f);

	for (int y = 0; y < GRID_SIZE; ++y)
	for (int x = 0; x < GRID_SIZE; ++x)
	{
		const tcu::Vec4&	color = ((x + y) % 2 == 0) ? (colorA) : (colorB);
		const tcu::Vec4		positions[6] =
		{
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
			tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f),
		};

		// copy cell vertices to the buffer.
		for (int v = 0; v < 6; ++v)
			memcpy(&dataBuf[m_spec.bufferOffset + m_spec.positionAttrOffset + m_spec.bufferStride * ((y * GRID_SIZE + x) * 6 + v)], positions[v].getPtr(), sizeof(positions[v]));

		// copy color to buffer
		if (m_spec.hasColorAttr)
			for (int v = 0; v < 6; ++v)
				memcpy(&dataBuf[m_spec.bufferOffset + m_spec.colorAttrOffset + m_spec.bufferStride * ((y * GRID_SIZE + x) * 6 + v)], color.getPtr(), sizeof(color));
	}

	gl.genBuffers(1, &m_buf);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buf);
	gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)dataBuf.size(), &dataBuf[0], GL_STATIC_DRAW);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	if (gl.getError() != GL_NO_ERROR)
		throw tcu::TestError("could not init buffer");
}